

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

void __thiscall osc::OutboundPacketStream::CheckForAvailableBundleSpace(OutboundPacketStream *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  OutOfBufferMemoryException *this_00;
  int iVar4;
  size_t required;
  OutboundPacketStream *this_local;
  
  sVar2 = Size(this);
  bVar1 = ElementSizeSlotRequired(this);
  iVar4 = 0;
  if (bVar1) {
    iVar4 = 4;
  }
  sVar3 = Capacity(this);
  if (sVar3 < sVar2 + (long)iVar4 + 0x10) {
    this_00 = (OutOfBufferMemoryException *)__cxa_allocate_exception(0x10);
    OutOfBufferMemoryException::OutOfBufferMemoryException(this_00,"out of buffer memory");
    __cxa_throw(this_00,&OutOfBufferMemoryException::typeinfo,
                OutOfBufferMemoryException::~OutOfBufferMemoryException);
  }
  return;
}

Assistant:

void OutboundPacketStream::CheckForAvailableBundleSpace()
{
    std::size_t required = Size() + ((ElementSizeSlotRequired())?4:0) + 16;

    if( required > Capacity() )
        throw OutOfBufferMemoryException();
}